

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void legacy_init(char **options)

{
  int iVar1;
  char *optname;
  char **run_options;
  char *ports_option;
  char **options_local;
  
  run_options = (char **)anon_var_dwarf_1defb;
  optname = (char *)options;
  if (options != (char **)0x0) {
    for (; *(long *)optname != 0; optname = optname + 0x10) {
      iVar1 = strcmp(*(char **)optname,"listening_ports");
      if (iVar1 == 0) {
        run_options = *(char ***)(optname + 8);
      }
    }
  }
  iVar1 = is_ssl_port_used((char *)run_options);
  if (iVar1 == 0) {
    mg_init_library(0);
  }
  else {
    mg_init_library(2);
  }
  return;
}

Assistant:

static void
legacy_init(const char **options)
{
	const char *ports_option = config_options[LISTENING_PORTS].default_value;

	if (options) {
		const char **run_options = options;
		const char *optname = config_options[LISTENING_PORTS].name;

		/* Try to find the "listening_ports" option */
		while (*run_options) {
			if (!strcmp(*run_options, optname)) {
				ports_option = run_options[1];
			}
			run_options += 2;
		}
	}

	if (is_ssl_port_used(ports_option)) {
		/* Initialize with SSL support */
		mg_init_library(MG_FEATURES_TLS);
	} else {
		/* Initialize without SSL support */
		mg_init_library(MG_FEATURES_DEFAULT);
	}
}